

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml_reporter.c
# Opt level: O2

int default_printer(xmlDocPtr doc)

{
  char *pcVar1;
  undefined8 uVar2;
  
  pcVar1 = (&file_prefix)[(long)context_stack_p * 5];
  uVar2 = xmlGetCharEncodingHandler(1);
  uVar2 = xmlOutputBufferCreateFile(pcVar1,uVar2);
  xmlSaveFormatFileTo(uVar2,doc,"UTF-8",1);
  return 0;
}

Assistant:

static int default_printer(xmlDocPtr doc)
{
    struct xml_suite_context *ctx = &context_stack[context_stack_p-1];
    xmlOutputBufferPtr outBuf
        = xmlOutputBufferCreateFile(ctx->outFile,
                                    xmlGetCharEncodingHandler(XML_CHAR_ENCODING_UTF8));
    xmlSaveFormatFileTo(outBuf, doc, "UTF-8", 1);

    return 0;
}